

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

void CVmRun::set_local_in_frame
               (vm_val_t *val,vm_val_t *fp,int varnum,int is_param,int is_ctx_local,int ctx_arr_idx)

{
  undefined4 uVar1;
  vm_val_t *pvVar2;
  int in_ECX;
  vm_val_t *in_RDI;
  int in_R8D;
  int32_t in_R9D;
  vm_val_t idxval;
  vm_val_t *cl;
  undefined8 in_stack_ffffffffffffffb8;
  int idx;
  vm_val_t *in_stack_ffffffffffffffc0;
  vm_val_t *in_stack_ffffffffffffffc8;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffd0;
  
  idx = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  if (in_ECX == 0) {
    if (in_R8D == 0) {
      pvVar2 = get_local_from_frame(in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20));
      uVar1 = *(undefined4 *)&in_RDI->field_0x4;
      pvVar2->typ = in_RDI->typ;
      *(undefined4 *)&pvVar2->field_0x4 = uVar1;
      pvVar2->val = in_RDI->val;
    }
    else {
      pvVar2 = get_local_from_frame(in_stack_ffffffffffffffc0,idx);
      vm_val_t::set_int((vm_val_t *)&stack0xffffffffffffffc8,in_R9D);
      set_index(pvVar2,(vm_val_t *)in_stack_ffffffffffffffd0.native_desc,in_stack_ffffffffffffffc8);
    }
  }
  else {
    pvVar2 = get_param_from_frame(in_RDI,idx);
    uVar1 = *(undefined4 *)&in_RDI->field_0x4;
    pvVar2->typ = in_RDI->typ;
    *(undefined4 *)&pvVar2->field_0x4 = uVar1;
    pvVar2->val = in_RDI->val;
  }
  return;
}

Assistant:

void CVmRun::set_local_in_frame(VMG_ const vm_val_t *val, vm_val_t *fp,
                                int varnum, int is_param,
                                int is_ctx_local, int ctx_arr_idx)
{
    /* check which kind of variable we have */
    if (is_param)
    {
        /* parameter - get it from the frame */
        *get_param_from_frame(vmg_ fp, varnum) = *val;
    }
    else if (is_ctx_local)
    {
        /* context local - get the context local */
        vm_val_t *cl = get_local_from_frame(vmg_ fp, varnum);

        /* index it to set the local */
        vm_val_t idxval;
        idxval.set_int(ctx_arr_idx);
        set_index(vmg_ cl, &idxval, val);
    }
    else
    {
        /* regular local - set it in the frame */
        *get_local_from_frame(vmg_ fp, varnum) = *val;
    }
}